

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::BinaryOp<5,_(rsg::Associativity)0>::evaluate
          (BinaryOp<5,_(rsg::Associativity)0> *this,ExecutionContext *execCtx)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 in_R9;
  
  (*this->m_leftValueExpr->_vptr_Expression[4])();
  (*this->m_rightValueExpr->_vptr_Expression[4])(this->m_rightValueExpr,execCtx);
  iVar1 = (*this->m_leftValueExpr->_vptr_Expression[5])();
  iVar2 = (*this->m_rightValueExpr->_vptr_Expression[5])();
  (*(this->super_Expression)._vptr_Expression[7])
            (this,&this->m_type,
             (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
             _M_impl.super__Vector_impl_data._M_start,CONCAT44(extraout_var,iVar1),extraout_RDX,
             in_R9,iVar2,extraout_EDX);
  return;
}

Assistant:

void BinaryOp<Precedence, Assoc>::evaluate (ExecutionContext& execCtx)
{
	m_leftValueExpr->evaluate(execCtx);
	m_rightValueExpr->evaluate(execCtx);

	ExecConstValueAccess	leftVal		= m_leftValueExpr->getValue();
	ExecConstValueAccess	rightVal	= m_rightValueExpr->getValue();
	ExecValueAccess			dst			= m_value.getValue(m_type);

	evaluate(dst, leftVal, rightVal);
}